

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::NameResolverTest_SingleFileServiceEdition2023_Test
::TestBody(NameResolverTest_SingleFileServiceEdition2023_Test *this)

{
  bool bVar1;
  ServiceDescriptor *descriptor;
  char *pcVar2;
  AssertHelper local_198;
  Message local_190;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  string local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  Options local_108;
  undefined1 local_b8 [8];
  ClassNameResolver resolver;
  ServiceDescriptor *service_descriptor;
  string_view local_20;
  NameResolverTest_SingleFileServiceEdition2023_Test *local_10;
  NameResolverTest_SingleFileServiceEdition2023_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&service_descriptor,
             "\n      edition = \"2023\";\n\n      option java_generic_services = true;\n\n      package proto2_unittest;\n\n      message Dummy {}\n      service FooService {\n        rpc FooMethod(Dummy) returns (Dummy) {}\n      }\n                "
            );
  NameResolverTest::BuildFileAndPopulatePool
            (&this->super_NameResolverTest,local_20,_service_descriptor);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&resolver.file_immutable_outer_class_names_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18),"proto2_unittest.FooService");
  descriptor = DescriptorPool::FindServiceByName
                         (&(this->super_NameResolverTest).pool_,stack0xffffffffffffffb8);
  Options::Options(&local_108);
  ClassNameResolver::ClassNameResolver((ClassNameResolver *)local_b8,&local_108);
  Options::~Options(&local_108);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_148,(ClassNameResolver *)local_b8,descriptor,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[31],_nullptr>
            ((EqHelper *)local_128,"resolver.GetClassName(service_descriptor, true)",
             "\"\" \"proto2_unittest.Foo.FooService\"",&local_148,
             (char (*) [31])"proto2_unittest.Foo.FooService");
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            (&local_188,(ClassNameResolver *)local_b8,descriptor);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[31],_nullptr>
            ((EqHelper *)local_168,"resolver.GetJavaImmutableClassName(service_descriptor)",
             "\"\" \"proto2_unittest.Foo$FooService\"",&local_188,
             (char (*) [31])"proto2_unittest.Foo$FooService");
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  ClassNameResolver::~ClassNameResolver((ClassNameResolver *)local_b8);
  return;
}

Assistant:

TEST_F(NameResolverTest, SingleFileServiceEdition2023) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2023";

      option java_generic_services = true;

      package proto2_unittest;

      message Dummy {}
      service FooService {
        rpc FooMethod(Dummy) returns (Dummy) {}
      }
                )schema");

  auto service_descriptor =
      pool_.FindServiceByName("proto2_unittest.FooService");
  ClassNameResolver resolver;
  EXPECT_EQ(resolver.GetClassName(service_descriptor, /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.Foo.FooService");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(service_descriptor),
            PACKAGE_PREFIX "proto2_unittest.Foo$FooService");
}